

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitExtractLaneExpr
          (WasmBytecodeGenerator *this,OpCodeAsmJs op,WasmType *signature)

{
  WasmRegisterSpace *this_00;
  EmitInfo local_44;
  EmitInfo indexInfo;
  RegSlot resultReg;
  EmitInfo simdArgInfo;
  WasmType simdArgType;
  WasmType resultType;
  WasmType *signature_local;
  OpCodeAsmJs op_local;
  WasmBytecodeGenerator *this_local;
  EmitInfo resultInfo;
  
  simdArgInfo.type = *signature;
  simdArgInfo.super_EmitInfoBase.location = signature[1];
  register0x00000000 =
       PopEvalStack(this,simdArgInfo.super_EmitInfoBase.location,L"Argument should be of type V128")
  ;
  ReleaseLocation(this,(EmitInfo *)&indexInfo.type);
  this_00 = GetRegisterSpace(this,simdArgInfo.type);
  indexInfo.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  EmitInfo::EmitInfo((EmitInfo *)&this_local,indexInfo.super_EmitInfoBase.location,&simdArgInfo.type
                    );
  local_44 = EmitLaneIndex(this,op);
  ReleaseLocation(this,&local_44);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x10])
            (this->m_writer,(ulong)op,(ulong)indexInfo.super_EmitInfoBase.location,
             (ulong)stack0xffffffffffffffc8 & 0xffffffff,(ulong)local_44 & 0xffffffff);
  return (EmitInfo)this_local;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitExtractLaneExpr(Js::OpCodeAsmJs op, const WasmTypes::WasmType* signature)
{
    WasmTypes::WasmType resultType = signature[0];
    WasmTypes::WasmType simdArgType = signature[1];

    EmitInfo simdArgInfo = PopEvalStack(simdArgType, _u("Argument should be of type V128"));
    ReleaseLocation(&simdArgInfo);

    Js::RegSlot resultReg = GetRegisterSpace(resultType)->AcquireTmpRegister();
    EmitInfo resultInfo(resultReg, resultType);

    //put index into a register to reuse the existing infra in Interpreter and Compiler
    EmitInfo indexInfo = EmitLaneIndex(op);
    ReleaseLocation(&indexInfo);

    m_writer->AsmReg3(op, resultReg, simdArgInfo.location, indexInfo.location);
    return resultInfo;
}